

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStream.cpp
# Opt level: O0

void __thiscall
DIS::DataStream::DataStream(DataStream *this,char *buffer,size_t length,Endian stream)

{
  char e;
  long one;
  Endian stream_local;
  size_t length_local;
  char *buffer_local;
  DataStream *this_local;
  
  memset(this,0,0x18);
  std::vector<char,_std::allocator<char>_>::vector(&this->_buffer);
  this->_read_pos = 0;
  this->_write_pos = 0;
  this->_stream_endian = stream;
  this->_machine_endian = LITTLE;
  this->_machine_endian = LITTLE;
  SetStream(this,buffer,length,stream);
  return;
}

Assistant:

DataStream::DataStream(const char* buffer, size_t length, Endian stream)
   : _buffer()
   , _read_pos(0)
   , _write_pos(0)
   , _stream_endian(stream)
   , _machine_endian(LITTLE)
{
   long one(1);
   char e = (reinterpret_cast<char*>( &one ))[0];

   if( e == (char)1 )
   {
      _machine_endian = LITTLE;
   }
   else
   {
      _machine_endian = BIG;
   }

   SetStream( buffer, length, stream );
}